

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrikeRegister.cpp
# Opt level: O1

Counter64 __thiscall
security::StrikeRegister::Expand(StrikeRegister *this,uint64_t partial,uint bytes)

{
  long lVar1;
  int in_ECX;
  ulong uVar2;
  uint64_t uVar3;
  uint uVar4;
  undefined4 in_register_00000014;
  ulong uVar5;
  long lVar6;
  
  lVar6 = CONCAT44(in_register_00000014,bytes);
  if (6 < in_ECX - 1U) {
    uVar3 = 0;
    goto LAB_00125eb8;
  }
  lVar1 = *(long *)(partial + 0x210);
  switch(in_ECX) {
  case 1:
    lVar6 = (long)(char)((char)bytes - (char)lVar1);
    break;
  case 2:
    lVar6 = (long)(short)((short)bytes - (short)lVar1);
    break;
  case 3:
    uVar4 = bytes - (int)lVar1;
    uVar3 = ((ulong)(uVar4 & 0xffffff) + lVar1) - (ulong)(uVar4 * 2 & 0x1000000);
    goto LAB_00125eb8;
  case 4:
    lVar6 = (long)(int)(bytes - (int)lVar1);
    break;
  case 5:
    uVar2 = lVar6 - lVar1 & 0xffffffffff;
    uVar5 = (lVar6 - lVar1) * 2;
    lVar6 = 0xffffffffff;
    goto LAB_00125eac;
  case 6:
    uVar2 = lVar6 - lVar1 & 0xffffffffffff;
    uVar5 = (lVar6 - lVar1) * 2;
    lVar6 = 0xffffffffffff;
    goto LAB_00125eac;
  case 7:
    uVar2 = lVar6 - lVar1 & 0xffffffffffffff;
    uVar5 = (lVar6 - lVar1) * 2;
    lVar6 = 0xffffffffffffff;
LAB_00125eac:
    uVar3 = (uVar2 + lVar1) - (lVar6 + 1U & uVar5);
    goto LAB_00125eb8;
  }
  uVar3 = lVar6 + lVar1;
LAB_00125eb8:
  this->SlidingWindow[0] = uVar3;
  return (Counter64)(unsigned_long)this;
}

Assistant:

Counter64 StrikeRegister::Expand(uint64_t partial, unsigned bytes) const
{
    SECURITY_DEBUG_ASSERT(bytes > 0 && bytes < 8);
    return CounterExpand(LargestSequence.ToUnsigned(), partial, bytes);
}